

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

Node * __thiscall Node::Link(Node *this,Node *Node0,Node *Node1,Node *Node2,Node *Node3,Node *Node4)

{
  if (Node0 != (Node *)0x0) {
    this->Tree[0] = Node0;
  }
  if (Node1 != (Node *)0x0) {
    this->Tree[1] = Node1;
  }
  if (Node2 != (Node *)0x0) {
    this->Tree[2] = Node2;
  }
  if (Node3 != (Node *)0x0) {
    this->Tree[3] = Node3;
  }
  if (Node4 != (Node *)0x0) {
    this->Tree[4] = Node4;
  }
  return this;
}

Assistant:

Node *Node::Link
(
	Node *Node0,	/**< Link to slot 0 */
	Node *Node1,	/**< Link to slot 1 */
	Node *Node2,	/**< Link to slot 2 */
	Node *Node3,	/**< Link to slot 3 */
	Node *Node4	/**< Link to slot 4 */
)
{
	//
	// Attach them together
	//
	if (Node0 != 0)
	{
		Tree[0] = Node0;
	}
	if (Node1 != 0)
	{
		Tree[1] = Node1;
	}
	if (Node2 != 0)
	{
		Tree[2] = Node2;
	}
	if (Node3 != 0)
	{
		Tree[3] = Node3;
	}
	if (Node4 != 0)
	{
		Tree[4] = Node4;
	}

	//
	// Return main node back
	//
	return(this);
}